

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CborMap::Put
          (Error *__return_storage_ptr__,CborMap *this,int aKey,uint8_t *aBytes,size_t aLength)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  _Bool local_125;
  anon_class_1_0_00000001 local_112;
  v10 local_111;
  v10 *local_110;
  size_t local_108;
  string local_100;
  _Bool local_d9;
  cn_cbor *pcStack_d8;
  bool succeed;
  cn_cbor *cborBytes;
  size_t aLength_local;
  uint8_t *aBytes_local;
  CborMap *pCStack_b8;
  int aKey_local;
  CborMap *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  cborBytes = (cn_cbor *)aLength;
  aLength_local = (size_t)aBytes;
  aBytes_local._4_4_ = aKey;
  pCStack_b8 = this;
  this_local = (CborMap *)__return_storage_ptr__;
  pcStack_d8 = cn_cbor_data_create(aBytes,(int)aLength,(cn_cbor_errback *)0x0);
  local_125 = false;
  if (pcStack_d8 != (cn_cbor *)0x0) {
    local_125 = cn_cbor_mapput_int((this->super_CborValue).mCbor,(long)aBytes_local._4_4_,pcStack_d8
                                   ,(cn_cbor_errback *)0x0);
  }
  local_d9 = local_125;
  if (local_125 == false) {
    Put::anon_class_1_0_00000001::operator()(&local_112);
    local_58 = &local_110;
    local_60 = &local_111;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_108 = bVar1.size_;
    local_110 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_78 = local_110;
    sStack_70 = local_108;
    local_50 = &local_78;
    local_88 = local_110;
    local_80 = local_108;
    local_68 = &local_100;
    local_48 = local_88;
    sStack_40 = local_80;
    local_a8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = local_a8;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_100,local_88,fmt,args);
    Error::Error(__return_storage_ptr__,kOutOfMemory,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Put(int aKey, const uint8_t *aBytes, size_t aLength)
{
    cn_cbor *cborBytes = cn_cbor_data_create(aBytes, aLength, nullptr);
    bool     succeed   = cborBytes && cn_cbor_mapput_int(mCbor, aKey, cborBytes, nullptr);
    return succeed ? ERROR_NONE : ERROR_OUT_OF_MEMORY("CBOR map insert bytes");
}